

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariableStackFrame.cpp
# Opt level: O0

void __thiscall Jinx::Impl::VariableStackFrame::VariableStackFrame(VariableStackFrame *this)

{
  reference this_00;
  StaticAllocator<char,_2048UL,_16UL> local_20;
  StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL> local_18;
  VariableStackFrame *local_10;
  VariableStackFrame *this_local;
  
  local_10 = this;
  StaticArena<2048UL,_16UL>::StaticArena(&this->m_staticArena);
  StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>::StaticAllocator
            (&local_18,&this->m_staticArena);
  std::
  vector<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
  ::vector(&this->m_frames,&local_18);
  StaticAllocator<char,_2048UL,_16UL>::StaticAllocator(&local_20,&this->m_staticArena);
  std::__cxx11::
  basic_string<char,_std::char_traits<char>,_Jinx::StaticAllocator<char,_2048UL,_16UL>_>::
  basic_string(&this->m_errorMessage,&local_20);
  std::
  vector<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
  ::emplace_back<>(&this->m_frames);
  this_00 = std::
            vector<Jinx::Impl::VariableStackFrame::FrameData,_Jinx::StaticAllocator<Jinx::Impl::VariableStackFrame::FrameData,_2048UL,_16UL>_>
            ::back(&this->m_frames);
  std::
  vector<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>,_Jinx::Allocator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::Allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>_>_>_>
  ::emplace_back<>(&this_00->stack);
  return;
}

Assistant:

inline_t VariableStackFrame::VariableStackFrame()
	{
		m_frames.emplace_back();
		m_frames.back().stack.emplace_back();
	}